

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O0

optional<InotifyEvent> * __thiscall
NonrecursiveInotifyPoller::GetNextEvent
          (optional<InotifyEvent> *__return_storage_ptr__,NonrecursiveInotifyPoller *this)

{
  size_t sVar1;
  uint uVar2;
  int *piVar3;
  mapped_type *pmVar4;
  allocator local_89;
  string local_88 [48];
  undefined1 local_58 [8];
  InotifyEvent event;
  ssize_t readlen;
  inotify_event ev;
  NonrecursiveInotifyPoller *this_local;
  
  ev._8_8_ = this;
  do {
    if (this->read_buffer_length_ < this->read_buffer_offset_ + 0x10) {
      event.path.field_2._8_8_ = read(this->fd_,this->read_buffer_,0x10000);
      if ((event.path.field_2._8_8_ == -1) &&
         ((piVar3 = __errno_location(), *piVar3 == 0xb ||
          (piVar3 = __errno_location(), *piVar3 == 0xb)))) {
        memset(__return_storage_ptr__,0,0x30);
        std::experimental::fundamentals_v1::optional<InotifyEvent>::optional(__return_storage_ptr__)
        ;
        return __return_storage_ptr__;
      }
      if ((long)event.path.field_2._8_8_ < 0x10) {
        __assert_fail("readlen >= (ssize_t)sizeof(struct inotify_event) && \"inotify read failed\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                      ,0x38,
                      "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
                     );
      }
      this->read_buffer_offset_ = 0;
      this->read_buffer_length_ = event.path.field_2._8_8_;
    }
    readlen = *(ssize_t *)(this->read_buffer_ + this->read_buffer_offset_);
    ev._0_8_ = *(undefined8 *)(this->read_buffer_ + this->read_buffer_offset_ + 8);
    this->read_buffer_offset_ = this->read_buffer_offset_ + 0x10;
    if (this->read_buffer_length_ < this->read_buffer_offset_) {
      __assert_fail("read_buffer_offset_ <= read_buffer_length_ && \"Attempted to escape read buffer\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                    ,0x41,
                    "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
                   );
    }
    if ((readlen & 0x800000000000U) != 0) {
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&this->directories_,(key_type_conflict *)&readlen);
    }
    if ((readlen & 0x400000000000U) != 0) {
      this->events_dropped_ = true;
    }
  } while (ev.mask == 0);
  InotifyEvent::InotifyEvent((InotifyEvent *)local_58);
  uVar2 = readlen._4_4_ & 0xfff;
  if (uVar2 == 2) {
    local_58._0_4_ = MODIFIED;
  }
  else {
    if (uVar2 != 0x40) {
      if ((uVar2 == 0x80) || (uVar2 == 0x100)) {
        local_58._0_4_ = CREATED;
        goto LAB_0018a642;
      }
      if (uVar2 != 0x200) {
        __assert_fail("0 && \"Unknown event type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                      ,0x5c,
                      "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
                     );
      }
    }
    local_58._0_4_ = DELETED;
  }
LAB_0018a642:
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->directories_,(key_type_conflict *)&readlen);
  std::__cxx11::string::operator=((string *)&event,(string *)pmVar4);
  sVar1 = this->read_buffer_offset_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,this->read_buffer_ + sVar1,&local_89);
  std::__cxx11::string::operator+=((string *)&event,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if ((readlen & 0x4000000000000000U) != 0) {
    std::__cxx11::string::operator+=((string *)&event,'/');
  }
  this->read_buffer_offset_ = ((ulong)ev._0_8_ >> 0x20) + this->read_buffer_offset_;
  if (this->read_buffer_offset_ <= this->read_buffer_length_) {
    std::experimental::fundamentals_v1::optional<InotifyEvent>::optional<InotifyEvent,_true>
              (__return_storage_ptr__,(InotifyEvent *)local_58);
    InotifyEvent::~InotifyEvent((InotifyEvent *)local_58);
    return __return_storage_ptr__;
  }
  __assert_fail("read_buffer_offset_ <= read_buffer_length_ && \"Attempted to escape read buffer\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                ,0x66,
                "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
               );
}

Assistant:

std::experimental::optional<InotifyEvent>
NonrecursiveInotifyPoller::GetNextEvent() {
  struct inotify_event ev;
  for (;;) {
    // Read new events from the kernel if needed.
    if (read_buffer_offset_ + sizeof(struct inotify_event) >
        read_buffer_length_) {
      ssize_t readlen = read(fd_, read_buffer_, sizeof(read_buffer_));
      if (readlen == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))
        return {};
      assert(readlen >= (ssize_t)sizeof(struct inotify_event) &&
             "inotify read failed");
      read_buffer_offset_ = 0;
      read_buffer_length_ = readlen;
    }

    // Copy next event from read buffer to get the alignment right.
    memcpy(&ev, read_buffer_ + read_buffer_offset_, sizeof(ev));
    read_buffer_offset_ += sizeof(ev);
    assert(read_buffer_offset_ <= read_buffer_length_ &&
           "Attempted to escape read buffer");

    // If the kernel is going to discard this watch, remove it from our
    // bookkeeping as well.
    if ((ev.mask & IN_IGNORED) != 0)
      directories_.erase(ev.wd);

    // Record that we've been dropping events.
    if ((ev.mask & IN_Q_OVERFLOW) != 0)
      events_dropped_ = true;

    if (ev.len > 0) {
      // Extract the event type.
      InotifyEvent event;
      switch (ev.mask & IN_ALL_EVENTS) {
        case IN_CREATE:
        case IN_MOVED_TO:
          event.type = InotifyEventType::CREATED;
          break;
        case IN_DELETE:
        case IN_MOVED_FROM:
          event.type = InotifyEventType::DELETED;
          break;
        case IN_MODIFY:
          event.type = InotifyEventType::MODIFIED;
          break;
        default:
          assert(0 && "Unknown event type");
      }

      // Extract the pathname string.
      event.path = directories_[ev.wd];
      event.path += std::string(read_buffer_ + read_buffer_offset_);
      if ((ev.mask & IN_ISDIR) != 0)
        event.path += '/';
      read_buffer_offset_ += ev.len;
      assert(read_buffer_offset_ <= read_buffer_length_ &&
             "Attempted to escape read buffer");
      return event;
    }
  }
}